

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_127a7::TestCheckEqualFailureIncludesCheckExpectedAndActual::
~TestCheckEqualFailureIncludesCheckExpectedAndActual
          (TestCheckEqualFailureIncludesCheckExpectedAndActual *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckEqualFailureIncludesCheckExpectedAndActual)
{
    RecordingReporter reporter;
    TestResults results(&reporter);
    const int something = 2;
    CheckEqual(results, 1, something, TestDetails("", "", "", 0));

	using namespace std;
    CHECK(strstr(reporter.lastFailedMessage, "xpected 1"));
    CHECK(strstr(reporter.lastFailedMessage, "was 2"));
}